

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall Image::setPixel(Image *this,int x,int y,Vector3f *color)

{
  uint __line;
  char *__assertion;
  
  if ((x < 0) || (this->_width <= x)) {
    __assertion = "x >= 0 && x < _width";
    __line = 0x23;
  }
  else {
    if ((-1 < y) && (y < this->_height)) {
      Vector3f::operator=((this->_data).super__Vector_base<Vector3f,_std::allocator<Vector3f>_>.
                          _M_impl.super__Vector_impl_data._M_start + (uint)(this->_width * y + x),
                          color);
      return;
    }
    __assertion = "y >= 0 && y < _height";
    __line = 0x24;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Image.h"
                ,__line,"void Image::setPixel(int, int, const Vector3f &)");
}

Assistant:

void setPixel(int x, int y, const Vector3f &color) {
        assert(x >= 0 && x < _width);
        assert(y >= 0 && y < _height);
        _data[y * _width + x] = color;
    }